

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

void __thiscall
TPZFrontSym<std::complex<double>_>::AddKel
          (TPZFrontSym<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  complex<double> *pcVar1;
  long lVar2;
  complex<double> *pcVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  complex<double> *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long row;
  long col;
  long lVar11;
  
  lVar2 = destinationindex->fNElements;
  row = 0;
  lVar9 = 0;
  if (0 < lVar2) {
    lVar9 = lVar2;
  }
  for (; row != lVar9; row = row + 1) {
    iVar6 = Local(this,destinationindex->fStore[row]);
    lVar11 = (long)iVar6;
    for (col = row; lVar2 != col; col = col + 1) {
      iVar6 = Local(this,destinationindex->fStore[col]);
      lVar10 = (long)iVar6;
      pcVar7 = TPZFMatrix<std::complex<double>_>::operator()(elmat,row,col);
      lVar8 = lVar10;
      if (lVar10 < lVar11) {
        lVar8 = lVar11;
      }
      if (lVar11 < lVar10) {
        lVar10 = lVar11;
      }
      lVar8 = ((lVar8 + 1) * lVar8) / 2;
      pcVar3 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
      dVar4 = *(double *)(pcVar7->_M_value + 8);
      pcVar1 = pcVar3 + lVar8 + lVar10;
      dVar5 = *(double *)(pcVar1->_M_value + 8);
      pcVar3 = pcVar3 + lVar8 + lVar10;
      *(double *)pcVar3->_M_value = *(double *)pcVar1->_M_value + *(double *)pcVar7->_M_value;
      *(double *)(pcVar3->_M_value + 8) = dVar5 + dVar4;
    }
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel = destinationindex.NElements();
	for(i=0;i<nel;i++){
		ilocal = this->Local(destinationindex[i]);
		for(j=i;j<nel;j++) {
			jlocal=this->Local(destinationindex[j]);
			this->Element(ilocal, jlocal)+=elmat(i,j);
		}
	}
	/*
	 output << "Dest Index " ;
	 for(i=0;i<nel;i++) output << destinationindex[i] << " ";
	 output << endl;
	 elmat.Print("Element matrix ",output);
	 PrintGlobal("After Assemb..." , output);
	 */
}